

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_shader.cpp
# Opt level: O2

void gen_sketch_shade(float *ca,float *cr,float *cl,float *cp,float *l,float *e,float *norm,float p,
                     float x,float y,float radius,float *line_dir,float *c)

{
  vec2 new_line;
  vec2 dot_dir;
  vec3 cnew;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c [3];
  
  gen_lambert_shade(ca,cr,cl,norm,l,c);
  gen_phong_shade(cl,cp,l,e,norm,(int)p,c);
  rgb_to_grayscale(c,c);
  if (0.1 < norm[2]) {
    local_4c = *line_dir + 0.1;
    local_48 = line_dir[1];
    local_44 = x;
    local_40 = y;
    vec2_norm(&local_4c,&local_4c);
    vec3_scale(local_3c,c,1.0);
    vec2_norm(&local_4c,&local_4c);
    draw_line(line_dir,radius,&local_44,c);
    draw_line(&local_4c,radius,&local_44,local_3c);
    if ((local_3c[0] != 0.0) || (NAN(local_3c[0]))) {
      return;
    }
  }
  vec3_scale(c,c,0.0);
  return;
}

Assistant:

void gen_sketch_shade(const vec3 ca, const vec3 cr, const vec3 cl, const vec3 cp, vec3 l, const vec3 e, const vec3 norm, const float p,
const float x, const float y, const float radius, vec2 line_dir, vec3 c){
    gen_lambert_shade(ca, cr, cl, norm, l, c);
    gen_phong_shade(cl, cp, l, e, norm, p, c);

    //calculate a grayscale output (using luminosity method)
    rgb_to_grayscale(c, c);

    //draw silhouette
    if(norm[2]<=0.1f){
        vec3_scale(c, c, 0.0f);
        return;
    }

    //draw inner sketch with a tilted overline
    vec2 dot_dir = {x, y};
    vec2 new_line = {line_dir[0] + 0.1f, line_dir[1]};
    vec2_norm(new_line, new_line);
    vec3 cnew;
    vec3_scale(cnew, c, 1.0f);
    vec2_norm(new_line, new_line);
    draw_line(line_dir, radius, dot_dir, c);
    draw_line(new_line, radius, dot_dir, cnew);

    //composite
    if(cnew[0]==0.0f) vec3_scale(c, c, 0.0f);
}